

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_ds.h
# Opt level: O0

void * stbds_arrgrowf(void *a,size_t elemsize,size_t addlen,size_t min_cap)

{
  undefined8 *puVar1;
  void *local_98;
  long local_90;
  long local_88;
  ulong local_78;
  long local_68;
  size_t min_len;
  void *b;
  stbds_array_header temp;
  size_t min_cap_local;
  size_t addlen_local;
  size_t elemsize_local;
  void *a_local;
  
  temp.temp = min_cap;
  memset(&b,0,0x20);
  if (a == (void *)0x0) {
    local_68 = 0;
  }
  else {
    local_68 = *(long *)((long)a + -0x20);
  }
  if ((ulong)temp.temp < local_68 + addlen) {
    temp.temp = local_68 + addlen;
  }
  if (a == (void *)0x0) {
    local_78 = 0;
  }
  else {
    local_78 = *(ulong *)((long)a + -0x18);
  }
  a_local = a;
  if (local_78 < (ulong)temp.temp) {
    if (a == (void *)0x0) {
      local_88 = 0;
    }
    else {
      local_88 = *(long *)((long)a + -0x18);
    }
    if ((ulong)temp.temp < (ulong)(local_88 << 1)) {
      if (a == (void *)0x0) {
        local_90 = 0;
      }
      else {
        local_90 = *(long *)((long)a + -0x18);
      }
      temp.temp = local_90 << 1;
    }
    else if ((ulong)temp.temp < 4) {
      temp.temp = 4;
    }
    if (a == (void *)0x0) {
      local_98 = (void *)0x0;
    }
    else {
      local_98 = (void *)((long)a + -0x20);
    }
    puVar1 = (undefined8 *)realloc(local_98,elemsize * temp.temp + 0x20);
    a_local = puVar1 + 4;
    if (a == (void *)0x0) {
      *puVar1 = 0;
      puVar1[2] = 0;
      puVar1[3] = 0;
    }
    puVar1[1] = temp.temp;
  }
  return a_local;
}

Assistant:

void *stbds_arrgrowf(void *a, size_t elemsize, size_t addlen, size_t min_cap)
{
  stbds_array_header temp={0}; // force debugging
  void *b;
  size_t min_len = stbds_arrlen(a) + addlen;
  (void) sizeof(temp);

  // compute the minimum capacity needed
  if (min_len > min_cap)
    min_cap = min_len;

  if (min_cap <= stbds_arrcap(a))
    return a;

  // increase needed capacity to guarantee O(1) amortized
  if (min_cap < 2 * stbds_arrcap(a))
    min_cap = 2 * stbds_arrcap(a);
  else if (min_cap < 4)
    min_cap = 4;

  //if (num_prev < 65536) if (a) prev_allocs[num_prev++] = (int *) ((char *) a+1);
  //if (num_prev == 2201)
  //  num_prev = num_prev;
  b = STBDS_REALLOC(NULL, (a) ? stbds_header(a) : 0, elemsize * min_cap + sizeof(stbds_array_header));
  //if (num_prev < 65536) prev_allocs[num_prev++] = (int *) (char *) b;
  b = (char *) b + sizeof(stbds_array_header);
  if (a == NULL) {
    stbds_header(b)->length = 0;
    stbds_header(b)->hash_table = 0;
    stbds_header(b)->temp = 0;
  } else {
    STBDS_STATS(++stbds_array_grow);
  }
  stbds_header(b)->capacity = min_cap;

  return b;
}